

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_symbol_codec.cpp
# Opt level: O0

raw_quasi_adaptive_huffman_data_model * __thiscall
lzham::raw_quasi_adaptive_huffman_data_model::operator=
          (raw_quasi_adaptive_huffman_data_model *this,raw_quasi_adaptive_huffman_data_model *rhs)

{
  decoder_tables *pdVar1;
  decoder_tables *in_RSI;
  decoder_tables *in_RDI;
  decoder_tables *local_8;
  
  local_8 = in_RDI;
  if (in_RDI != in_RSI) {
    in_RDI->m_max_codes[7] = in_RSI->m_max_codes[7];
    in_RDI->m_max_codes[8] = in_RSI->m_max_codes[8];
    in_RDI->m_max_codes[9] = in_RSI->m_max_codes[9];
    in_RDI->m_max_codes[10] = in_RSI->m_max_codes[10];
    in_RDI->m_max_codes[0xb] = in_RSI->m_max_codes[0xb];
    vector<unsigned_short>::operator=
              ((vector<unsigned_short> *)in_RSI,(vector<unsigned_short> *)in_RDI);
    vector<unsigned_short>::operator=
              ((vector<unsigned_short> *)in_RSI,(vector<unsigned_short> *)in_RDI);
    vector<unsigned_char>::operator=
              ((vector<unsigned_char> *)in_RSI,(vector<unsigned_char> *)in_RDI);
    if (*(long *)(in_RSI->m_max_codes + 5) == 0) {
      lzham_delete<lzham::prefix_coding::decoder_tables>((decoder_tables *)0x13c72c);
      *(undefined8 *)(in_RDI->m_max_codes + 5) = 0;
    }
    else if (*(long *)(in_RDI->m_max_codes + 5) == 0) {
      pdVar1 = lzham_new<lzham::prefix_coding::decoder_tables,lzham::prefix_coding::decoder_tables>
                         (in_RSI);
      *(decoder_tables **)(in_RDI->m_max_codes + 5) = pdVar1;
      if (*(long *)(in_RDI->m_max_codes + 5) == 0) {
        clear((raw_quasi_adaptive_huffman_data_model *)in_RDI);
        return (raw_quasi_adaptive_huffman_data_model *)in_RDI;
      }
    }
    else {
      prefix_coding::decoder_tables::operator=(in_RSI,in_RDI);
    }
    *(char *)(in_RDI->m_max_codes + 0xc) = (char)in_RSI->m_max_codes[0xc];
    *(byte *)((long)in_RDI->m_max_codes + 0x31) = *(byte *)((long)in_RSI->m_max_codes + 0x31) & 1;
    *(byte *)((long)in_RDI->m_max_codes + 0x32) = *(byte *)((long)in_RSI->m_max_codes + 0x32) & 1;
    *(byte *)((long)in_RDI->m_max_codes + 0x33) = *(byte *)((long)in_RSI->m_max_codes + 0x33) & 1;
    local_8 = in_RDI;
  }
  return (raw_quasi_adaptive_huffman_data_model *)local_8;
}

Assistant:

raw_quasi_adaptive_huffman_data_model& raw_quasi_adaptive_huffman_data_model::operator= (const raw_quasi_adaptive_huffman_data_model& rhs)
   {
      if (this == &rhs)
         return *this;

      m_total_syms = rhs.m_total_syms;

      m_max_cycle = rhs.m_max_cycle;
      m_update_cycle = rhs.m_update_cycle;
      m_symbols_until_update = rhs.m_symbols_until_update;

      m_total_count = rhs.m_total_count;

      m_sym_freq = rhs.m_sym_freq;

      m_codes = rhs.m_codes;
      m_code_sizes = rhs.m_code_sizes;

      if (rhs.m_pDecode_tables)
      {
         if (m_pDecode_tables)
            *m_pDecode_tables = *rhs.m_pDecode_tables;
         else
         {
            m_pDecode_tables = lzham_new<prefix_coding::decoder_tables>(*rhs.m_pDecode_tables);
            if (!m_pDecode_tables)
            {
               clear();
               return *this;
            }
         }
      }
      else
      {
         lzham_delete(m_pDecode_tables);
         m_pDecode_tables = NULL;
      }

      m_decoder_table_bits = rhs.m_decoder_table_bits;
      m_encoding = rhs.m_encoding;
      m_fast_updating = rhs.m_fast_updating;
      m_use_polar_codes = rhs.m_use_polar_codes;

      return *this;
   }